

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O2

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
efsw::FileWatcherGeneric::directories_abi_cxx11_
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,FileWatcherGeneric *this)

{
  _List_node_base *p_Var1;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  Mutex::lock(&this->mWatchesLock);
  p_Var1 = (_List_node_base *)&this->mWatches;
  while (p_Var1 = (((_List_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->mWatches) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)((long)p_Var1[1]._M_next + 0x10));
  }
  Mutex::unlock(&this->mWatchesLock);
  return __return_storage_ptr__;
}

Assistant:

std::list<std::string> FileWatcherGeneric::directories()
{
	std::list<std::string> dirs;

	mWatchesLock.lock();

	WatchList::iterator it = mWatches.begin();

	for ( ; it != mWatches.end(); it++ )
	{
		dirs.push_back( (*it)->Directory );
	}

	mWatchesLock.unlock();

	return dirs;
}